

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O0

bool __thiscall
crnlib::mipmapped_texture::generate_mipmaps
          (mipmapped_texture *this,generate_mipmap_params *params,bool force)

{
  image_u8 *this_00;
  uint uVar1;
  bool bVar2;
  uint uVar3;
  mip_level *pmVar4;
  vector<crnlib::mip_level_*> *pvVar5;
  mip_level **ppmVar6;
  byte in_DL;
  undefined8 *in_RSI;
  mipmapped_texture *in_RDI;
  crnlib *this_01;
  uint l_2;
  uint f_2;
  resample_params rparams;
  image_u8 *pMip;
  uint mip_height;
  uint mip_width;
  uint l_1;
  image_u8 *pImg;
  image_u8 tmp;
  uint f_1;
  uint l;
  uint f;
  face_vec faces;
  uint height;
  uint width;
  uint num_levels;
  uint in_stack_fffffffffffffe48;
  orientation_flags_t in_stack_fffffffffffffe4c;
  mipmapped_texture *in_stack_fffffffffffffe50;
  image_u8 *in_stack_fffffffffffffe58;
  mipmapped_texture *in_stack_fffffffffffffe60;
  image<crnlib::color_quad<unsigned_char,_int>_> *in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe80;
  component_flags in_stack_fffffffffffffe84;
  uint local_d8;
  uint local_d4;
  resample_params local_d0;
  image_u8 *local_a8;
  uint local_9c;
  uint local_98;
  uint local_94;
  image_u8 *local_90;
  uint local_54;
  uint local_50;
  uint local_3c;
  vector<crnlib::vector<crnlib::mip_level_*>_> local_38;
  uint local_28;
  uint local_24;
  uint local_20;
  byte local_19;
  undefined8 *local_18;
  byte local_1;
  
  local_19 = in_DL & 1;
  local_18 = in_RSI;
  bVar2 = is_valid((mipmapped_texture *)0x170eb7);
  if (bVar2) {
    local_20 = 1;
    local_24 = get_width(in_RDI);
    local_28 = get_height(in_RDI);
    while( true ) {
      bVar2 = true;
      if (local_24 <= *(uint *)(local_18 + 3)) {
        bVar2 = *(uint *)(local_18 + 3) < local_28;
      }
      if (!bVar2) break;
      local_24 = local_24 >> 1;
      local_28 = local_28 >> 1;
      local_20 = local_20 + 1;
    }
    if ((*(int *)((long)local_18 + 0x1c) != 0) && (*(uint *)((long)local_18 + 0x1c) < local_20)) {
      local_20 = *(uint *)((long)local_18 + 0x1c);
    }
    if ((local_19 & 1) != 0) {
      uVar3 = get_num_levels((mipmapped_texture *)
                             CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      if (1 < uVar3) {
        discard_mipmaps(in_stack_fffffffffffffe50);
      }
    }
    uVar1 = local_20;
    uVar3 = get_num_levels((mipmapped_texture *)
                           CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    if (uVar1 == uVar3) {
      local_1 = 1;
    }
    else {
      get_num_faces((mipmapped_texture *)0x171013);
      vector<crnlib::vector<crnlib::mip_level_*>_>::vector
                ((vector<crnlib::vector<crnlib::mip_level_*>_> *)in_stack_fffffffffffffe50,
                 in_stack_fffffffffffffe4c);
      local_3c = 0;
      while( true ) {
        uVar1 = local_3c;
        uVar3 = vector<crnlib::vector<crnlib::mip_level_*>_>::size(&local_38);
        if (uVar3 <= uVar1) break;
        vector<crnlib::vector<crnlib::mip_level_*>_>::operator[](&local_38,local_3c);
        vector<crnlib::mip_level_*>::resize
                  ((vector<crnlib::mip_level_*> *)in_stack_fffffffffffffe60,
                   (uint)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                   SUB81((ulong)in_stack_fffffffffffffe58 >> 0x18,0));
        for (local_50 = 0; local_50 < local_20; local_50 = local_50 + 1) {
          pmVar4 = crnlib_new<crnlib::mip_level>();
          pvVar5 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[](&local_38,local_3c);
          ppmVar6 = vector<crnlib::mip_level_*>::operator[](pvVar5,local_50);
          *ppmVar6 = pmVar4;
        }
        local_3c = local_3c + 1;
      }
      local_54 = 0;
      while( true ) {
        uVar1 = local_54;
        uVar3 = vector<crnlib::vector<crnlib::mip_level_*>_>::size(&local_38);
        if (uVar3 <= uVar1) break;
        image<crnlib::color_quad<unsigned_char,_int>_>::image
                  ((image<crnlib::color_quad<unsigned_char,_int>_> *)0x1711b3);
        get_level(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48);
        local_90 = mip_level::get_unpacked_image
                             ((mip_level *)in_stack_fffffffffffffe58,
                              (image_u8 *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
        for (local_94 = 0; local_94 < local_20; local_94 = local_94 + 1) {
          uVar3 = get_width(in_RDI);
          local_98 = math::maximum<unsigned_int>(1,uVar3 >> ((byte)local_94 & 0x1f));
          uVar3 = get_height(in_RDI);
          this_01 = (crnlib *)0x1;
          local_9c = math::maximum<unsigned_int>(1,uVar3 >> ((byte)local_94 & 0x1f));
          local_a8 = (image_u8 *)
                     crnlib_new<crnlib::image<crnlib::color_quad<unsigned_char,int>>>(this_01);
          if (local_94 != 0) {
            image_utils::resample_params::resample_params(&local_d0);
            local_d0.m_dst_width = local_98;
            local_d0.m_dst_height = local_9c;
            local_d0.m_filter_scale = *(float *)((long)local_18 + 0xc);
            local_d0.m_first_comp = 0;
            bVar2 = image<crnlib::color_quad<unsigned_char,_int>_>::is_component_valid
                              ((image<crnlib::color_quad<unsigned_char,_int>_> *)
                               in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
            local_d0.m_num_comps = bVar2 + 3;
            local_d0.m_srgb = (bool)(*(byte *)((long)local_18 + 9) & 1);
            local_d0.m_wrapping = (bool)(*(byte *)(local_18 + 1) & 1);
            local_d0.m_pFilter = (char *)*local_18;
            local_d0.m_multithreaded = (bool)(*(byte *)((long)local_18 + 0x14) & 1);
            bVar2 = image_utils::resample
                              (in_stack_fffffffffffffe58,(image_u8 *)in_stack_fffffffffffffe50,
                               (resample_params *)
                               CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
            if (bVar2) {
              if ((*(byte *)((long)local_18 + 10) & 1) != 0) {
                image_utils::renorm_normal_map
                          ((image_u8 *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80)
                          );
              }
              this_00 = local_a8;
              in_stack_fffffffffffffe84 =
                   image<crnlib::color_quad<unsigned_char,_int>_>::get_comp_flags(local_90);
              image<crnlib::color_quad<unsigned_char,_int>_>::set_comp_flags
                        (this_00,in_stack_fffffffffffffe84);
              goto LAB_00171577;
            }
            crnlib_delete<crnlib::image<crnlib::color_quad<unsigned_char,int>>>
                      ((image<crnlib::color_quad<unsigned_char,_int>_> *)0x171414);
            local_d4 = 0;
            while( true ) {
              uVar3 = vector<crnlib::vector<crnlib::mip_level_*>_>::size(&local_38);
              if (uVar3 <= local_d4) break;
              local_d8 = 0;
              while( true ) {
                pvVar5 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[]
                                   (&local_38,local_d4);
                uVar3 = vector<crnlib::mip_level_*>::size(pvVar5);
                if (uVar3 <= local_d8) break;
                pvVar5 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[]
                                   (&local_38,local_d4);
                vector<crnlib::mip_level_*>::operator[](pvVar5,local_d8);
                crnlib_delete<crnlib::mip_level>((mip_level *)0x1714dc);
                local_d8 = local_d8 + 1;
              }
              local_d4 = local_d4 + 1;
            }
            local_1 = 0;
            bVar2 = true;
            goto LAB_0017162b;
          }
          image<crnlib::color_quad<unsigned_char,_int>_>::operator=
                    (in_stack_fffffffffffffe68,
                     (image<crnlib::color_quad<unsigned_char,_int>_> *)in_stack_fffffffffffffe60);
LAB_00171577:
          pvVar5 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[](&local_38,local_54);
          in_stack_fffffffffffffe68 =
               (image<crnlib::color_quad<unsigned_char,_int>_> *)
               vector<crnlib::mip_level_*>::operator[](pvVar5,local_94);
          in_stack_fffffffffffffe50 = *(mipmapped_texture **)in_stack_fffffffffffffe68;
          in_stack_fffffffffffffe58 = local_a8;
          in_stack_fffffffffffffe60 =
               (mipmapped_texture *)
               get_level(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,
                         in_stack_fffffffffffffe48);
          in_stack_fffffffffffffe4c =
               mip_level::get_orientation_flags((mip_level *)in_stack_fffffffffffffe60);
          mip_level::assign((mip_level *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                            (pixel_format)((ulong)in_stack_fffffffffffffe50 >> 0x20),
                            (orientation_flags_t)in_stack_fffffffffffffe50);
        }
        bVar2 = false;
LAB_0017162b:
        image<crnlib::color_quad<unsigned_char,_int>_>::~image
                  ((image<crnlib::color_quad<unsigned_char,_int>_> *)0x171638);
        if (bVar2) goto LAB_00171687;
        local_54 = local_54 + 1;
      }
      assign(in_stack_fffffffffffffe60,(face_vec *)in_stack_fffffffffffffe58);
      local_1 = 1;
LAB_00171687:
      vector<crnlib::vector<crnlib::mip_level_*>_>::~vector
                ((vector<crnlib::vector<crnlib::mip_level_*>_> *)in_stack_fffffffffffffe50);
    }
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool mipmapped_texture::generate_mipmaps(const generate_mipmap_params& params, bool force) {
  CRNLIB_ASSERT(is_valid());
  if (!is_valid())
    return false;

  uint num_levels = 1;
  {
    uint width = get_width();
    uint height = get_height();
    while ((width > params.m_min_mip_size) || (height > params.m_min_mip_size)) {
      width >>= 1U;
      height >>= 1U;
      num_levels++;
    }
  }

  if ((params.m_max_mips > 0) && (num_levels > params.m_max_mips))
    num_levels = params.m_max_mips;

  if ((force) && (get_num_levels() > 1))
    discard_mipmaps();

  if (num_levels == get_num_levels())
    return true;

  face_vec faces(get_num_faces());
  for (uint f = 0; f < faces.size(); f++) {
    faces[f].resize(num_levels);
    for (uint l = 0; l < num_levels; l++)
      faces[f][l] = crnlib_new<mip_level>();
  }

  for (uint f = 0; f < faces.size(); f++) {
    image_u8 tmp;
    image_u8* pImg = get_level(f, 0)->get_unpacked_image(tmp, cUnpackFlagUncook);

    for (uint l = 0; l < num_levels; l++) {
      const uint mip_width = math::maximum<uint>(1U, get_width() >> l);
      const uint mip_height = math::maximum<uint>(1U, get_height() >> l);

      image_u8* pMip = crnlib_new<image_u8>();

      if (!l)
        *pMip = *pImg;
      else {
        image_utils::resample_params rparams;
        rparams.m_dst_width = mip_width;
        rparams.m_dst_height = mip_height;
        rparams.m_filter_scale = params.m_filter_scale;
        rparams.m_first_comp = 0;
        rparams.m_num_comps = pImg->is_component_valid(3) ? 4 : 3;
        rparams.m_srgb = params.m_srgb;
        rparams.m_wrapping = params.m_wrapping;
        rparams.m_pFilter = params.m_pFilter;
        rparams.m_multithreaded = params.m_multithreaded;

        if (!image_utils::resample(*pImg, *pMip, rparams)) {
          crnlib_delete(pMip);

          for (uint f = 0; f < faces.size(); f++)
            for (uint l = 0; l < faces[f].size(); l++)
              crnlib_delete(faces[f][l]);

          return false;
        }

        if (params.m_renormalize)
          image_utils::renorm_normal_map(*pMip);

        pMip->set_comp_flags(pImg->get_comp_flags());
      }

      faces[f][l]->assign(pMip, PIXEL_FMT_INVALID, get_level(f, 0)->get_orientation_flags());
    }
  }

  assign(faces);

  CRNLIB_ASSERT(check());

  return true;
}